

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.cpp
# Opt level: O0

void __thiscall ki::protocol::dml::MessageHeader::read_from(MessageHeader *this,istream *istream)

{
  uchar uVar1;
  unsigned_short uVar2;
  Field<unsigned_char> *pFVar3;
  Field<unsigned_short> *pFVar4;
  ostringstream oss;
  parse_error *e;
  string local_100 [32];
  Field<unsigned_short> *local_e0;
  Field<unsigned_short> *size;
  string local_d0 [32];
  Field<unsigned_char> *local_b0;
  Field<unsigned_char> *type;
  allocator local_91;
  string local_90 [32];
  Field<unsigned_char> *local_70;
  Field<unsigned_char> *service_id;
  Record record;
  istream *istream_local;
  MessageHeader *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)istream;
  ki::dml::Record::Record((Record *)&service_id);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"m_service_id",&local_91);
  pFVar3 = ki::dml::Record::add_field<unsigned_char>((Record *)&service_id,(string *)local_90,true);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_70 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"m_type",(allocator *)((long)&size + 7));
  pFVar3 = ki::dml::Record::add_field<unsigned_char>((Record *)&service_id,(string *)local_d0,true);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
  local_b0 = pFVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"m_size",(allocator *)((long)&e + 7));
  pFVar4 = ki::dml::Record::add_field<unsigned_short>
                     ((Record *)&service_id,(string *)local_100,true);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_e0 = pFVar4;
  ki::dml::Record::read_from
            ((Record *)&service_id,
             (istream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar1 = ki::dml::Field<unsigned_char>::get_value(local_70);
  this->m_service_id = uVar1;
  uVar1 = ki::dml::Field<unsigned_char>::get_value(local_b0);
  this->m_type = uVar1;
  uVar2 = ki::dml::Field<unsigned_short>::get_value(local_e0);
  this->m_size = uVar2 - 4;
  ki::dml::Record::~Record((Record *)&service_id);
  return;
}

Assistant:

void MessageHeader::read_from(std::istream& istream)
	{
		ki::dml::Record record;
		const auto *service_id = record.add_field<ki::dml::UBYT>("m_service_id");
		const auto *type = record.add_field<ki::dml::UBYT>("m_type");
		const auto size = record.add_field<ki::dml::USHRT>("m_size");

		try
		{
			record.read_from(istream);
		}
		catch (ki::dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading MessageHeader: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_HEADER_DATA);
		}

		m_service_id = service_id->get_value();
		m_type = type->get_value();
		m_size = size->get_value() - 4;
	}